

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

uint_t __thiscall shm_test::ClientReaderThread::threadFunc(ClientReaderThread *this)

{
  int iVar1;
  undefined4 extraout_var;
  uint_t uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  Array<char,_axl::sl::ArrayDetails<char>_> buffer;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> local_68;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_50;
  
  local_68.m_p = (char *)0x0;
  local_68.m_hdr = (Hdr *)0x0;
  local_68.m_count = 0;
  iVar3 = 0;
  uVar5 = 0;
  do {
    iVar1 = (**this->m_transport->_vptr_Transport)(this->m_transport,&local_68);
    uVar4 = CONCAT44(extraout_var,iVar1);
    if (uVar4 == 0xffffffffffffffff) {
      axl::err::getLastErrorDescription();
      if (local_50.m_length == 0) {
        local_50.m_p = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
      }
      printf("client: read error: %s\n",local_50.m_p);
      axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_50);
LAB_0011d86c:
      uVar2 = 0xffffffff;
      goto LAB_0011d871;
    }
    if (uVar4 < 8) {
      puts("client: buffer too small");
      goto LAB_0011d86c;
    }
    if ((*(int *)local_68.m_p != 1) || ((ulong)*(uint *)((long)local_68.m_p + 4) + 8 != uVar4)) {
      printf("client: invalid reply: %d (%d)\n");
      goto LAB_0011d86c;
    }
    uVar5 = uVar5 + *(uint *)((long)local_68.m_p + 4);
    uVar4 = uVar5 * 100 >> 0x1a;
    iVar1 = (int)uVar4;
    if (iVar3 != iVar1) {
      printf("\b\b\b\b%d%%",uVar4 & 0xffffffff);
      iVar3 = iVar1;
    }
  } while (uVar5 < 0x4000000);
  uVar2 = 0;
  printf("\nReading 100%% (done), %zd bytes\n",uVar5);
LAB_0011d871:
  axl::sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::release(&local_68);
  return uVar2;
}

Assistant:

uint_t
	threadFunc() {
		ASSERT(m_transport);

		int percentage = 0;
		size_t totalSize = 0;

		sl::Array<char> buffer;

		while (totalSize < TotalSize) {
			size_t receivedSize = m_transport->readMessage(&buffer);
			if (receivedSize == -1) {
				printf("client: read error: %s\n", err::getLastErrorDescription().sz());
				return -1;
			}

			if (receivedSize < sizeof(ReqHdr)) {
				printf("client: buffer too small\n");
				return -1;
			}

			ReqHdr* reply = (ReqHdr*)buffer.cp();
			if (reply->m_code != ReqCode_Reply || sizeof(ReqHdr) + reply->m_size != receivedSize) {
				printf("client: invalid reply: %d (%d)\n", reply->m_code, reply->m_size);
				return -1;
			}

			totalSize += reply->m_size;

			int newPercentage = (uint64_t)totalSize * 100 / TotalSize;
			if (newPercentage != percentage) {
				percentage = newPercentage;
				printf("\b\b\b\b%d%%", percentage);
			}
		}

		printf("\nReading 100%% (done), %zd bytes\n", totalSize);
		return 0;
	}